

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld)

{
  u8 uVar1;
  u8 uVar2;
  char *pcVar3;
  undefined1 uVar4;
  int iVar5;
  uint uVar6;
  FKey *pFKey;
  sColMap *psVar7;
  Expr *pEVar8;
  Expr *pEVar9;
  Expr *pRight;
  ExprList *pEList;
  SrcList *pSrc;
  Select *p;
  Trigger *p_00;
  Schema *pSVar10;
  Select *pSVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  sqlite3 *db;
  Expr *local_f0;
  Expr *local_e0;
  ExprList *local_c0;
  TriggerStep *local_b8;
  int *aiCol;
  ulong local_a0;
  sqlite3 *local_98;
  Index *pIdx;
  Token tOld;
  Token tToCol;
  Token tFromCol;
  Token tNew;
  
  if ((pParse->db->flags & 0x40000) != 0) {
    pFKey = sqlite3FkReferences(pTab);
    uVar14 = (ulong)(pChanges != (ExprList *)0x0);
    local_a0 = uVar14;
    for (; pFKey != (FKey *)0x0; pFKey = pFKey->pNextTo) {
      uVar1 = pFKey->aAction[uVar14];
      p_00 = pFKey->apTrigger[uVar14];
      if (p_00 == (Trigger *)0x0 && uVar1 != '\0') {
        db = pParse->db;
        pIdx = (Index *)0x0;
        aiCol = (int *)0x0;
        iVar5 = sqlite3FkLocateIndex(pParse,pTab,pFKey,&pIdx,&aiCol);
        if (iVar5 == 0) {
          lVar13 = 0;
          local_f0 = (Expr *)0x0;
          local_c0 = (ExprList *)0x0;
          local_e0 = (Expr *)0x0;
          local_98 = db;
          for (lVar12 = 0; lVar12 < pFKey->nCol; lVar12 = lVar12 + 1) {
            tOld.z = "old";
            tOld.n = 3;
            tOld._12_4_ = 0;
            psVar7 = (sColMap *)((long)aiCol + lVar13);
            if (aiCol == (int *)0x0) {
              psVar7 = pFKey->aCol;
            }
            tNew.z = "new";
            tNew.n = 3;
            tNew._12_4_ = 0;
            tToCol.z = "oid";
            if (pIdx != (Index *)0x0) {
              tToCol.z = pTab->aCol[*(int *)((long)pIdx->aiColumn + lVar13)].zName;
            }
            iVar5 = psVar7->iFrom;
            pcVar3 = pFKey->pFrom->aCol[iVar5].zName;
            tFromCol.z = pcVar3;
            tToCol.n = sqlite3Strlen30(tToCol.z);
            tFromCol.n = sqlite3Strlen30(pcVar3);
            pEVar8 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&tOld);
            pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&tToCol);
            pEVar8 = sqlite3PExpr(pParse,0x76,pEVar8,pEVar9,(Token *)0x0);
            pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&tFromCol);
            pEVar8 = sqlite3PExpr(pParse,0x4c,pEVar8,pEVar9,(Token *)0x0);
            db = local_98;
            local_f0 = sqlite3ExprAnd(local_98,local_f0,pEVar8);
            if (pChanges != (ExprList *)0x0) {
              pEVar8 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&tOld);
              pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&tToCol);
              pEVar8 = sqlite3PExpr(pParse,0x76,pEVar8,pEVar9,(Token *)0x0);
              pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&tNew);
              pRight = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&tToCol);
              pEVar9 = sqlite3PExpr(pParse,0x76,pEVar9,pRight,(Token *)0x0);
              db = local_98;
              pEVar8 = sqlite3PExpr(pParse,0x46,pEVar8,pEVar9,(Token *)0x0);
              local_e0 = sqlite3ExprAnd(db,local_e0,pEVar8);
            }
            if ((uVar1 != '\t' || pChanges != (ExprList *)0x0) && uVar1 != '\x06') {
              if (uVar1 == '\b') {
                pEVar8 = pFKey->pFrom->aCol[iVar5].pDflt;
                if (pEVar8 == (Expr *)0x0) goto LAB_001602a1;
                pEVar8 = sqlite3ExprDup(db,pEVar8,0);
              }
              else {
                if (uVar1 == '\t') {
                  pEVar8 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&tNew);
                  pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&tToCol);
                  iVar5 = 0x76;
                }
                else {
LAB_001602a1:
                  iVar5 = 0x62;
                  pEVar8 = (Expr *)0x0;
                  pEVar9 = (Expr *)0x0;
                }
                pEVar8 = sqlite3PExpr(pParse,iVar5,pEVar8,pEVar9,(Token *)0x0);
              }
              local_c0 = sqlite3ExprListAppend(pParse,local_c0,pEVar8);
              sqlite3ExprListSetName(pParse,local_c0,&tFromCol,0);
            }
            lVar13 = lVar13 + 4;
          }
          sqlite3DbFree(db,aiCol);
          pcVar3 = pFKey->pFrom->zName;
          uVar6 = sqlite3Strlen30(pcVar3);
          if (uVar1 == '\x06') {
            tOld.n = uVar6;
            tOld.z = pcVar3;
            pEVar8 = sqlite3Expr(db,0x38,"foreign key constraint failed");
            if (pEVar8 != (Expr *)0x0) {
              pEVar8->affinity = '\x02';
            }
            pEList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar8);
            pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,&tOld,(Token *)0x0);
            p = sqlite3SelectNew(pParse,pEList,pSrc,local_f0,(ExprList *)0x0,(Expr *)0x0,
                                 (ExprList *)0x0,0,(Expr *)0x0,(Expr *)0x0);
            local_f0 = (Expr *)0x0;
          }
          else {
            p = (Select *)0x0;
          }
          uVar2 = (db->lookaside).bEnabled;
          (db->lookaside).bEnabled = '\0';
          p_00 = (Trigger *)sqlite3DbMallocZero(db,uVar6 + 0x99);
          if (p_00 == (Trigger *)0x0) {
            local_b8 = (TriggerStep *)0x0;
          }
          else {
            local_b8 = (TriggerStep *)(p_00 + 1);
            p_00->step_list = local_b8;
            p_00[1].pWhen = (Expr *)&p_00[2].table;
            *(uint *)&p_00[1].pColumns = uVar6;
            memcpy(&p_00[2].table,pcVar3,(ulong)uVar6);
            pSVar10 = (Schema *)sqlite3ExprDup(db,local_f0,1);
            p_00[1].pSchema = pSVar10;
            pSVar10 = (Schema *)sqlite3ExprListDup(db,local_c0,1);
            p_00[1].pTabSchema = pSVar10;
            pSVar11 = sqlite3SelectDup(db,p,1);
            *(Select **)&p_00[1].op = pSVar11;
            if (local_e0 == (Expr *)0x0) {
              local_e0 = (Expr *)0x0;
            }
            else {
              local_e0 = sqlite3PExpr(pParse,0x13,local_e0,(Expr *)0x0,(Token *)0x0);
              pEVar8 = sqlite3ExprDup(db,local_e0,1);
              p_00->pWhen = pEVar8;
            }
          }
          (db->lookaside).bEnabled = uVar2;
          sqlite3ExprDelete(db,local_f0);
          sqlite3ExprDelete(db,local_e0);
          sqlite3ExprListDelete(db,local_c0);
          sqlite3SelectDelete(db,p);
          if (db->mallocFailed != '\x01') {
            if (uVar1 == '\x06') {
              uVar4 = 0x74;
            }
            else if ((uVar1 == '\t') && (pChanges == (ExprList *)0x0)) {
              uVar4 = 0x6a;
            }
            else {
              uVar4 = 0x6b;
            }
            local_b8->op = uVar4;
            local_b8->pTrig = p_00;
            pSVar10 = pTab->pSchema;
            p_00->pSchema = pSVar10;
            p_00->pTabSchema = pSVar10;
            pFKey->apTrigger[local_a0] = p_00;
            p_00->op = pChanges != (ExprList *)0x0 | 0x6a;
            uVar14 = local_a0;
            goto LAB_00160547;
          }
          fkTriggerDelete(db,p_00);
          uVar14 = local_a0;
        }
      }
      else if (p_00 != (Trigger *)0x0) {
LAB_00160547:
        sqlite3CodeRowTriggerDirect(pParse,p_00,pTab,regOld,2,0);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld                      /* Address of array containing old row */
){
  /* If foreign-key support is enabled, iterate through all FKs that 
  ** refer to table pTab. If there is an action associated with the FK 
  ** for this operation (either update or delete), invoke the associated 
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      Trigger *pAction = fkActionTrigger(pParse, pTab, pFKey, pChanges);
      if( pAction ){
        sqlite3CodeRowTriggerDirect(pParse, pAction, pTab, regOld, OE_Abort, 0);
      }
    }
  }
}